

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pixels.c
# Opt level: O1

_Bool try_display_format(ALLEGRO_DISPLAY *display,int *format)

{
  _Bool _Var1;
  int iVar2;
  long lVar3;
  
  if (display == (ALLEGRO_DISPLAY *)0x0) {
    return false;
  }
  iVar2 = al_get_display_format(display);
  if ((format_is_real[iVar2] == true) &&
     ((lVar3 = (long)*format, lVar3 - 0x1cU < 0xffffffffffffffe7 ||
      (pixel_sizes[lVar3] == pixel_sizes[iVar2])))) {
    if (format_alpha_table[lVar3] == true) {
      if (format_alpha_table[iVar2] == false) {
        if (iVar2 == 0x12) {
          iVar2 = 0x11;
        }
        else if (iVar2 == 0x16) {
          iVar2 = 10;
        }
        else {
          if (iVar2 != 0x17) goto LAB_0015dec6;
          iVar2 = 9;
        }
      }
    }
    else if (format_alpha_table[iVar2] == true) {
      if (iVar2 == 0x11) {
        iVar2 = 0x12;
      }
      else if (iVar2 == 10) {
        iVar2 = 0x16;
      }
      else {
        if (iVar2 != 9) goto LAB_0015dec6;
        iVar2 = 0x17;
      }
    }
    *format = iVar2;
    _Var1 = true;
  }
  else {
LAB_0015dec6:
    _Var1 = false;
  }
  return _Var1;
}

Assistant:

static bool try_display_format(ALLEGRO_DISPLAY *display, int *format)
{
   int best_format;
   int bytes;

   if (!display) {
      return false;
   }

   best_format = al_get_display_format(display);
   if (!_al_pixel_format_is_real(best_format))
      return false;

   bytes = al_get_pixel_size(*format);
   if (bytes && bytes != al_get_pixel_size(best_format))
      return false;

   if (_al_pixel_format_has_alpha(*format) &&
      !_al_pixel_format_has_alpha(best_format)) {
      switch (best_format) {
         case ALLEGRO_PIXEL_FORMAT_RGBX_8888:
            *format = ALLEGRO_PIXEL_FORMAT_RGBA_8888;
            return true;
         case ALLEGRO_PIXEL_FORMAT_XRGB_8888:
             *format = ALLEGRO_PIXEL_FORMAT_ARGB_8888;
            return true;
         case ALLEGRO_PIXEL_FORMAT_XBGR_8888:
            *format = ALLEGRO_PIXEL_FORMAT_ABGR_8888;
            return true;
         default:
            return false;
      }
   }
   if (!_al_pixel_format_has_alpha(*format) &&
      _al_pixel_format_has_alpha(best_format)) {
      switch (best_format) {
         case ALLEGRO_PIXEL_FORMAT_RGBA_8888:
            *format = ALLEGRO_PIXEL_FORMAT_RGBX_8888;
            return true;
         case ALLEGRO_PIXEL_FORMAT_ARGB_8888:
             *format = ALLEGRO_PIXEL_FORMAT_XRGB_8888;
            return true;
         case ALLEGRO_PIXEL_FORMAT_ABGR_8888:
            *format = ALLEGRO_PIXEL_FORMAT_XBGR_8888;
            return true;
         default:
            return false;
      }
   }
   *format = best_format;
   return true;
}